

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiColorMod>::push_back(ImVector<ImGuiColorMod> *this,ImGuiColorMod *v)

{
  undefined8 uVar1;
  ImGuiColorMod *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiColorMod> *in_RDI;
  ImVector<ImGuiColorMod> *unaff_retaddr;
  ImVector<ImGuiColorMod> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->Col = (int)uVar1;
  (pIVar2->BackupValue).x = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = in_RSI[1];
  (pIVar2->BackupValue).y = (float)(int)uVar1;
  (pIVar2->BackupValue).z = (float)(int)((ulong)uVar1 >> 0x20);
  (pIVar2->BackupValue).w = *(float *)(in_RSI + 2);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }